

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O3

void __thiscall
slang::ast::builtins::ArrayUniqueMethod::ArrayUniqueMethod
          (ArrayUniqueMethod *this,KnownSystemName knownNameId,bool isIndexed)

{
  string_view sVar1;
  
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005dafe8;
  sVar1 = parsing::toString(knownNameId);
  (this->super_SystemSubroutine).name._M_dataplus._M_p =
       (pointer)&(this->super_SystemSubroutine).name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->super_SystemSubroutine).name,sVar1._M_str,sVar1._M_str + sVar1._M_len
            );
  (this->super_SystemSubroutine).kind = Function;
  (this->super_SystemSubroutine).knownNameId = knownNameId;
  (this->super_SystemSubroutine).hasOutputArgs = false;
  (this->super_SystemSubroutine).neverReturns = false;
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005d55c0;
  this->isIndexed = isIndexed;
  (this->super_SystemSubroutine).withClauseMode = Iterator;
  return;
}

Assistant:

ArrayUniqueMethod(KnownSystemName knownNameId, bool isIndexed) :
        SystemSubroutine(knownNameId, SubroutineKind::Function), isIndexed(isIndexed) {
        withClauseMode = WithClauseMode::Iterator;
    }